

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O0

void cjson_compare_should_compare_objects(void)

{
  cJSON_bool cVar1;
  
  cVar1 = compare_from_string("{}","{}",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x9f);
  }
  cVar1 = compare_from_string("{}","{}",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xa0);
  }
  cVar1 = compare_from_string("{\"false\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,
                              "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xa5);
  }
  cVar1 = compare_from_string("{\"False\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,
                              "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xa9);
  }
  cVar1 = compare_from_string("{\"False\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,
                              "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xad);
  }
  cVar1 = compare_from_string("{\"Flse\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,
                              "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}"
                              ,0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xb1);
  }
  cVar1 = compare_from_string("{\"one\": 1, \"two\": 2}","{\"one\": 1, \"two\": 2, \"three\": 3}",1)
  ;
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xb6);
  }
  cVar1 = compare_from_string("{\"one\": 1, \"two\": 2}","{\"one\": 1, \"two\": 2, \"three\": 3}",0)
  ;
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xba);
  }
  return;
}

Assistant:

static void cjson_compare_should_compare_objects(void)
{
    TEST_ASSERT_TRUE(compare_from_string("{}", "{}", true));
    TEST_ASSERT_TRUE(compare_from_string("{}", "{}", false));

    TEST_ASSERT_TRUE(compare_from_string(
                "{\"false\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                true));
    TEST_ASSERT_FALSE(compare_from_string(
                "{\"False\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                true));
    TEST_ASSERT_TRUE(compare_from_string(
                "{\"False\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                false));
    TEST_ASSERT_FALSE(compare_from_string(
                "{\"Flse\": false, \"true\": true, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                "{\"true\": true, \"false\": false, \"null\": null, \"number\": 42, \"string\": \"string\", \"array\": [], \"object\": {}}",
                false));
    /* test objects that are a subset of each other */
    TEST_ASSERT_FALSE(compare_from_string(
                "{\"one\": 1, \"two\": 2}",
                "{\"one\": 1, \"two\": 2, \"three\": 3}",
                true))
    TEST_ASSERT_FALSE(compare_from_string(
                "{\"one\": 1, \"two\": 2}",
                "{\"one\": 1, \"two\": 2, \"three\": 3}",
                false))
}